

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidySetInCharEncoding(TidyDoc tdoc,ctmbstr encnam)

{
  int iVar1;
  Bool BVar2;
  int enc;
  TidyDocImpl *impl;
  ctmbstr encnam_local;
  TidyDoc tdoc_local;
  
  if (tdoc != (TidyDoc)0x0) {
    iVar1 = prvTidyCharEncodingId((TidyDocImpl *)tdoc,encnam);
    if ((-1 < iVar1) &&
       (BVar2 = prvTidySetOptionInt((TidyDocImpl *)tdoc,TidyInCharEncoding,(long)iVar1), BVar2 != no
       )) {
      return 0;
    }
    prvTidyReportBadArgument((TidyDocImpl *)tdoc,"in-char-encoding");
  }
  return -0x16;
}

Assistant:

int TIDY_CALL           tidySetInCharEncoding( TidyDoc tdoc, ctmbstr encnam )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
    {
        int enc = TY_(CharEncodingId)( impl, encnam );
        if ( enc >= 0 && TY_(SetOptionInt)( impl, TidyInCharEncoding, enc ) )
            return 0;

        TY_(ReportBadArgument)( impl, "in-char-encoding" );
    }
    return -EINVAL;
}